

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O1

void absl::lts_20250127::container_internal::ClearBackingArray
               (CommonFields *c,PolicyFunctions *policy,bool reuse,bool soo_enabled)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined7 in_register_00000011;
  
  uVar3 = (ulong)((uint)c->size_ & 1);
  c->size_ = uVar3;
  if ((int)CONCAT71(in_register_00000011,reuse) == 0) {
    if (uVar3 != 0) {
      CommonFields::backing_array_start(c);
    }
    if ((c->size_ & 1) != 0) {
      CommonFields::backing_array_start(c);
    }
    (*policy->dealloc)(c,policy);
    c->capacity_ = (ulong)soo_enabled;
    c->size_ = 0;
    (c->heap_or_soo_).heap.control = (ctrl_t *)0x3bc980;
  }
  else {
    if ((soo_enabled) && (c->capacity_ < 2)) {
      __assert_fail("!soo_enabled || c.capacity() > SooCapacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0x157,
                    "void absl::container_internal::ClearBackingArray(CommonFields &, const PolicyFunctions &, bool, bool)"
                   );
    }
    sVar1 = c->capacity_;
    pcVar4 = (c->heap_or_soo_).heap.control;
    memset(pcVar4,0x80,sVar1 + 0x10);
    pcVar4[sVar1] = kSentinel;
    pcVar4 = (c->heap_or_soo_).heap.control + -8;
    if (((ulong)pcVar4 & 7) != 0) {
      __assert_fail("(reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0) && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x590,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
    }
    uVar3 = c->capacity_;
    if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
      __assert_fail("(IsValidCapacity(capacity)) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x622,"size_t absl::container_internal::CapacityToGrowth(size_t)");
    }
    uVar2 = c->size_;
    *(ulong *)pcVar4 = uVar3 - ((uVar2 >> 1) + (uVar3 >> 3));
    if ((uVar2 & 1) != 0) {
      CommonFields::backing_array_start(c);
      return;
    }
  }
  return;
}

Assistant:

void ClearBackingArray(CommonFields& c, const PolicyFunctions& policy,
                       bool reuse, bool soo_enabled) {
  c.set_size(0);
  if (reuse) {
    assert(!soo_enabled || c.capacity() > SooCapacity());
    ResetCtrl(c, policy.slot_size);
    ResetGrowthLeft(c);
    c.infoz().RecordStorageChanged(0, c.capacity());
  } else {
    // We need to record infoz before calling dealloc, which will unregister
    // infoz.
    c.infoz().RecordClearedReservation();
    c.infoz().RecordStorageChanged(0, soo_enabled ? SooCapacity() : 0);
    (*policy.dealloc)(c, policy);
    c = soo_enabled ? CommonFields{soo_tag_t{}} : CommonFields{non_soo_tag_t{}};
  }
}